

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroSet
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 in_register_0000000c;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  uint in_R8D;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  initializer_list<AssemblyTemplateArgument> variables;
  string macroText;
  string local_190;
  char *local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  char *local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  char *local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  char *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  char *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  char *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  char *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  string local_50;
  
  uVar6 = in_R8D & 7;
  uVar8 = in_R8D & 6;
  bVar12 = (uVar6 - 3 & 0xfffffffd) == 0;
  pcVar9 = 
  "\n\t\t\txor\t\t%rd%,%rs%,%rt%\n\t\t\t.if %eq%\n\t\t\t\tsltiu\t%rd%,%rd%,1\n\t\t\t.else\n\t\t\t\tsltu\t%rd%,r0,%rd%\n\t\t\t.endif\n\t\t"
  ;
  if ((in_R8D & 0x200) != 0) {
    pcVar9 = 
    "\n\t\t\t.if %imm% & ~0xFFFF\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\txor\t\t%rd%,%rs%,%rd%\n\t\t\t.else\n\t\t\t\txori\t%rd%,%rs%,%imm%\n\t\t\t.endif\n\t\t\t.if %eq%\n\t\t\t\tsltiu\t%rd%,%rd%,1\n\t\t\t.else\n\t\t\t\tsltu\t%rd%,r0,%rd%\n\t\t\t.endif\n\t\t"
    ;
  }
  if ((uVar6 != 1) && (uVar6 != 6)) {
    bVar3 = (uVar8 == 2 || uVar8 == 4) & (byte)(in_R8D >> 9);
    pcVar9 = 
    "\n\t\t\t.if %revcmp%\n\t\t\t\tslt%u%\t%rd%,%rt%,%rs%\n\t\t\t.else\n\t\t\t\tslt%u%\t%rd%,%rs%,%rt%\n\t\t\t.endif\n\t\t\txori\t%rd%,%rd%,1\n\t\t"
    ;
    if (bVar3 != 0) {
      pcVar9 = 
      "\n\t\t\t.if %revcmp% && %imm% == 0\n\t\t\t\tslt%u%\t%rd%,r0,%rs%\n\t\t\t.elseif %revcmp%\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\tslt%u%\t%rd%,%rd%,%rs%\n\t\t\t.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\tslt%u%\t%rd%,%rs%,%rd%\n\t\t\t.else\n\t\t\t\tslti%u%\t%rd%,%rs%,%imm%\n\t\t\t.endif\n\t\t\t.if %ge%\n\t\t\t\txori\t%rd%,%rd%,1\n\t\t\t.endif\n\t\t"
      ;
    }
    if (uVar8 != 4 && bVar3 == 0) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )parser;
    }
  }
  preprocessMacro_abi_cxx11_
            (&local_190,pcVar9,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_170 = "%u%";
  pcVar9 = " ";
  if (bVar12) {
    pcVar9 = "u";
  }
  local_168[0] = local_158;
  pcVar4 = "";
  if (bVar12) {
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar9,pcVar4);
  local_148 = "%eq%";
  pcVar4 = "1";
  pcVar9 = "0";
  if (uVar6 == 6) {
    pcVar9 = "1";
  }
  local_140[0] = local_130;
  pcVar10 = "";
  pcVar5 = "";
  if (uVar6 == 6) {
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,pcVar9,pcVar5);
  local_120 = "%ge%";
  pcVar9 = "0";
  if (uVar8 == 4) {
    pcVar9 = "1";
  }
  local_118[0] = local_108;
  pcVar5 = "";
  if (uVar8 == 4) {
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,pcVar9,pcVar5);
  bVar12 = (in_R8D >> 0x13 & 1) == 0;
  local_f8 = "%revcmp%";
  if (bVar12) {
    pcVar4 = "0";
  }
  local_f0[0] = local_e0;
  if (bVar12) {
    pcVar10 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,pcVar4,pcVar10);
  local_d0 = "%rd%";
  local_c8[0] = local_b8;
  lVar7 = *(long *)&immediates[1].primary.expression.constExpression;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,lVar7,*(long *)&immediates[1].primary.value + lVar7);
  local_a8 = "%rs%";
  local_a0[0] = local_90;
  peVar1 = (immediates->primary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,peVar1,
             (long)&((immediates->primary).expression.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  local_80 = "%rt%";
  local_78[0] = local_68;
  p_Var2 = (immediates->secondary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,p_Var2,
             (long)&p_Var2->_vptr__Sp_counted_base +
             *(long *)&(immediates->secondary).expression.constExpression);
  local_58 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_50,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_170;
  createMacro(parser,(string *)registers,(int)&local_190,variables);
  lVar7 = -0x140;
  paVar11 = &local_50.field_2;
  do {
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar11->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                      paVar11->_M_allocated_capacity + 1);
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar11->_M_allocated_capacity + -5);
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroSet(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	int type = flags & MIPSM_CONDITIONMASK;

	bool ne = type == MIPSM_NE;
	bool eq = type == MIPSM_EQ;
	bool ge = type == MIPSM_GE || type == MIPSM_GEU;
	bool lt = type == MIPSM_LT || type == MIPSM_LTU;
	bool unsigned_ = type == MIPSM_GEU || type == MIPSM_LTU;
	bool immediate = (flags & MIPSM_IMM) != 0;
	bool revcmp = (flags & MIPSM_REVCMP) != 0;

	if (immediate && (ne || eq))
	{
		const char* templateImmediateEqNe = R"(
			.if %imm% & ~0xFFFF
				li		%rd%,%imm%
				xor		%rd%,%rs%,%rd%
			.else
				xori	%rd%,%rs%,%imm%
			.endif
			.if %eq%
				sltiu	%rd%,%rd%,1
			.else
				sltu	%rd%,r0,%rd%
			.endif
		)";

		selectedTemplate = templateImmediateEqNe;
	} else if (ne || eq)
	{
		const char* templateEqNe = R"(
			xor		%rd%,%rs%,%rt%
			.if %eq%
				sltiu	%rd%,%rd%,1
			.else
				sltu	%rd%,r0,%rd%
			.endif
		)";

		selectedTemplate = templateEqNe;
	} else if (immediate && (ge || lt))
	{
		const char* templateImmediateGeLt = R"(
			.if %revcmp% && %imm% == 0
				slt%u%	%rd%,r0,%rs%
			.elseif %revcmp%
				li		%rd%,%imm%
				slt%u%	%rd%,%rd%,%rs%
			.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)
				li		%rd%,%imm%
				slt%u%	%rd%,%rs%,%rd%
			.else
				slti%u%	%rd%,%rs%,%imm%
			.endif
			.if %ge%
				xori	%rd%,%rd%,1
			.endif
		)";

		selectedTemplate = templateImmediateGeLt;
	} else if (ge)
	{
		const char* templateGe = R"(
			.if %revcmp%
				slt%u%	%rd%,%rt%,%rs%
			.else
				slt%u%	%rd%,%rs%,%rt%
			.endif
			xori	%rd%,%rd%,1
		)";

		selectedTemplate = templateGe;
	} else
	{
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%u%",		unsigned_ ? "u" : " "},
			{ "%eq%",		eq ? "1" : "0" },
			{ "%ge%",		ge ? "1" : "0" },
			{ "%revcmp%",	revcmp ? "1" : "0" },
			{ "%rd%",		registers.grd.name.string() },
			{ "%rs%",		registers.grs.name.string() },
			{ "%rt%",		registers.grt.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
	});
}